

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brent.c
# Opt level: O1

double brent_local_min(custom_funcuni *funcuni,double a,double b,double t,double eps,double *x)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double local_98;
  double local_38;
  
  dVar2 = (b - a) * 0.3819660112501051 + a;
  *x = dVar2;
  dVar3 = (*funcuni->funcuni)(dVar2,funcuni->params);
  dVar4 = *x;
  dVar15 = ABS(dVar4) * eps + t;
  dVar6 = dVar15 + dVar15;
  dVar5 = (a + b) * 0.5;
  if ((b - a) * -0.5 + dVar6 < ABS(dVar4 - dVar5)) {
    dVar7 = 0.0;
    dVar11 = dVar3;
    dVar14 = dVar2;
    dVar16 = dVar3;
    dVar13 = dVar3;
    local_38 = a;
    do {
      if (ABS(dVar7) <= dVar15) {
        dVar9 = 0.0;
        dVar3 = 0.0;
        dVar8 = 0.0;
        local_98 = dVar7;
      }
      else {
        dVar9 = (dVar11 - dVar16) * (dVar4 - dVar2);
        dVar3 = (dVar11 - dVar13) * (dVar4 - dVar14);
        dVar8 = (dVar4 - dVar14) * dVar3 - (dVar4 - dVar2) * dVar9;
        dVar3 = dVar3 - dVar9;
        dVar3 = dVar3 + dVar3;
        dVar12 = -dVar3;
        dVar9 = (double)(~-(ulong)(dVar12 < dVar3) & (ulong)dVar8 |
                        (ulong)-dVar8 & -(ulong)(dVar12 < dVar3));
        dVar8 = dVar7;
        if (dVar3 <= dVar12) {
          dVar3 = dVar12;
        }
      }
      if (((ABS(dVar3 * 0.5 * dVar8) <= ABS(dVar9)) || ((local_38 - dVar4) * dVar3 <= dVar9)) ||
         ((b - dVar4) * dVar3 <= dVar9)) {
        dVar7 = (double)(~-(ulong)(dVar4 < dVar5) & (ulong)local_38 |
                        -(ulong)(dVar4 < dVar5) & (ulong)b) - dVar4;
        dVar8 = dVar7 * 0.3819660112501051;
      }
      else {
        dVar12 = dVar4 + dVar9 / dVar3;
        dVar7 = local_98;
        if (((dVar12 - local_38 < dVar6) || (dVar8 = dVar9 / dVar3, b - dVar12 < dVar6)) &&
           (dVar8 = dVar15, dVar5 <= dVar4)) {
          dVar8 = -dVar15;
        }
      }
      if (dVar15 <= ABS(dVar8)) {
        dVar4 = dVar4 + dVar8;
      }
      else if (dVar8 <= 0.0) {
        dVar4 = dVar4 - dVar15;
      }
      else {
        dVar4 = dVar4 + dVar15;
      }
      dVar6 = (*funcuni->funcuni)(dVar4,funcuni->params);
      dVar5 = *x;
      uVar1 = -(ulong)(dVar4 < dVar5);
      dVar9 = dVar2;
      dVar12 = dVar13;
      if (dVar6 <= dVar11) {
        if (dVar5 <= dVar4) {
          local_38 = dVar5;
        }
        b = (double)(~uVar1 & (ulong)b | uVar1 & (ulong)dVar5);
        *x = dVar4;
        dVar10 = dVar5;
        dVar3 = dVar6;
      }
      else {
        dVar3 = dVar4;
        if (dVar5 <= dVar4) {
          dVar3 = local_38;
        }
        local_38 = dVar3;
        b = (double)((ulong)b & uVar1 | ~uVar1 & (ulong)dVar4);
        dVar10 = dVar4;
        dVar3 = dVar11;
        dVar11 = dVar6;
        if (dVar13 < dVar6) {
          if ((dVar2 != dVar5) || (NAN(dVar2) || NAN(dVar5))) {
            dVar10 = dVar2;
            dVar11 = dVar13;
            if (dVar16 < dVar6) {
              if (((dVar14 != dVar5) || (NAN(dVar14) || NAN(dVar5))) &&
                 ((dVar9 = dVar14, dVar12 = dVar16, dVar14 != dVar2 || (NAN(dVar14) || NAN(dVar2))))
                 ) goto LAB_00139521;
            }
            dVar9 = dVar4;
            dVar12 = dVar6;
          }
        }
      }
LAB_00139521:
      dVar13 = dVar11;
      dVar4 = *x;
      dVar15 = ABS(dVar4) * eps + t;
      dVar6 = dVar15 + dVar15;
      dVar5 = (b + local_38) * 0.5;
      dVar2 = dVar10;
      dVar11 = dVar3;
      dVar14 = dVar9;
      dVar16 = dVar12;
      local_98 = dVar8;
    } while ((b - local_38) * -0.5 + dVar6 < ABS(dVar4 - dVar5));
  }
  return dVar3;
}

Assistant:

double brent_local_min(custom_funcuni *funcuni, double a, double b, double t, double eps, double *x) {
	double c,d,e,m,p,q,r,tol,t2;
	double u,v,w,fu,fv,fw,fx;
	double fd;
	
	fd = eps;
	
	c = (3.0 - sqrt(5.0)) / 2.0;
	*x = a + c * (b - a);
	w = *x; v = w;
	e = 0;
	fx = FUNCUNI_EVAL(funcuni,*x);
	fw = fx; fv = fw;
	
	m = 0.5 * (a + b);
	tol = fd * fabs(*x) + t;
	t2 = 2.0 * tol;
	
	while (fabs(*x - m) > t2 - 0.5 * (b - a)) {
		p = 0; q = 0; r = 0;
		
		if (fabs(e) > tol) {
			r = (*x - w) * (fx - fv);
			q = (*x - v) * (fx - fw);
			p = (*x - v) * q - (*x - w) * r;
			q = 2.0 * (q - r);
			if (q > 0.0) {
				p = -p;
			} else {
				q = -q;
			}
			r = e;
			e = d;
		}
		
		if (fabs(p) < fabs(0.5 * q * r) && p < q * (a - *x) && p < q * (b - *x)) {
			d = p / q;
			u = *x + d;
			
			if ( (u - a) < t2 || (b - u) < t2) {
				if (*x < m) {
					d = tol;
				} else {
					d = -tol;
				}
			}
		} else {
			if (*x < m) {
				e = b - *x;
			} else {
				e = a - *x;
			}
			d = c * e;
		}
		
		if (fabs(d) >= tol) {
			u = *x + d;
		} else if (d > 0) {
			u = *x + tol;
		} else {
			u = *x - tol;
		}
		
		fu = FUNCUNI_EVAL(funcuni,u);
		
		if (fu <= fx) {
			if (u < *x) {
				b = *x;
			} else {
				a = *x;
			}
			v = w;
			fv = fw;
			w = *x;
			fw = fx;
			*x = u;
			fx = fu;
		} else {
			if (u < *x) {
				a = u;
			} else {
				b = u;
			}
			if (fu <= fw || w == *x) {
				v = w;
				fv = fw;
				w = u;
				fw = fu;
			} else if (fu <= fv || v == *x || v == w) {
				v = u;
				fv = fu;
			}
		}
		
		//End of the loop
		m = 0.5 * (a + b);
		tol = fd * fabs(*x) + t;
		t2 = 2.0 * tol;
		
	}
	
	return fx;
}